

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstructCondense<double>::ContributeKULocal
          (TPZDohrSubstructCondense<double> *this,double alpha,TPZFMatrix<double> *u,
          TPZFMatrix<double> *z)

{
  _Rb_tree_header *p_Var1;
  double dVar2;
  int iVar3;
  uint uVar4;
  TPZMatRed<double,_TPZFMatrix<double>_> *pTVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  double *pdVar8;
  ulong uVar9;
  long cols;
  ulong col;
  uint uVar10;
  ulong uVar11;
  ulong row;
  Numbering relat2;
  Numbering relat;
  TPZFMatrix<double> resloc;
  TPZFMatrix<double> resglobal;
  TPZFMatrix<double> resborder;
  TPZFMatrix<double> uborder;
  TPZFMatrix<double> uloc;
  key_type local_318;
  double local_310;
  key_type local_308;
  TPZFMatrix<double> local_300;
  TPZFMatrix<double> local_270;
  TPZFMatrix<double> local_1e0;
  TPZFMatrix<double> local_150;
  TPZFMatrix<double> local_c0;
  
  iVar3 = this->fNEquations;
  cols = (long)(int)(u->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  uVar10 = iVar3 - this->fNumInternalEquations;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZFMatrix<double>::TPZFMatrix(&local_c0,(long)iVar3,cols,(double *)&local_150);
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZFMatrix<double>::TPZFMatrix
            (&local_150,(long)this->fNEquations - (long)this->fNumInternalEquations,cols,
             (double *)&local_1e0);
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZFMatrix<double>::TPZFMatrix
            (&local_1e0,(long)this->fNEquations - (long)this->fNumInternalEquations,cols,
             (double *)&local_270);
  local_308.first = ExternalFirst;
  local_308.second = Submesh;
  local_318.first = InternalFirst;
  local_318.second = Submesh;
  cVar6 = std::
          _Rb_tree<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>,_std::_Select1st<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
          ::find(&(this->fPermutationsScatter)._M_t,&local_308);
  cVar7 = std::
          _Rb_tree<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>,_std::_Select1st<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
          ::find(&(this->fPermutationsScatter)._M_t,&local_318);
  p_Var1 = &(this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar7._M_node != p_Var1 && (_Rb_tree_header *)cVar6._M_node != p_Var1) {
    PermuteScatter((TPZVec<int> *)&cVar6._M_node[1]._M_parent,u,&local_c0,0,
                   (int)(u->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow);
    PermuteGather((TPZVec<int> *)&cVar7._M_node[1]._M_parent,&local_c0,&local_150,
                  this->fNumInternalEquations,this->fNEquations);
    pTVar5 = ((this->fMatRed).fRef)->fPointer;
    (*(pTVar5->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x25])
              (pTVar5,&local_150,&local_1e0,0);
    local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)0x0;
    TPZFMatrix<double>::TPZFMatrix(&local_270,(long)iVar3,cols,(double *)&local_300);
    local_310 = 0.0;
    TPZFMatrix<double>::TPZFMatrix(&local_300,(long)this->fNumExternalEquations,cols,&local_310);
    PermuteScatter((TPZVec<int> *)&cVar7._M_node[1]._M_parent,&local_1e0,&local_270,
                   this->fNumInternalEquations,this->fNEquations);
    row = 0;
    PermuteGather((TPZVec<int> *)&cVar6._M_node[1]._M_parent,&local_270,&local_300,0,
                  (int)(u->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow);
    uVar4 = (uint)(z->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    uVar9 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar9 = row;
    }
    uVar11 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar11 = row;
    }
    for (; row != uVar11; row = row + 1) {
      for (col = 0; uVar9 != col; col = col + 1) {
        pdVar8 = TPZFMatrix<double>::operator()(&local_300,row,col);
        dVar2 = *pdVar8;
        pdVar8 = TPZFMatrix<double>::operator()(z,row,col);
        *pdVar8 = dVar2 * alpha + *pdVar8;
      }
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_300);
    TPZFMatrix<double>::~TPZFMatrix(&local_270);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_1e0);
  TPZFMatrix<double>::~TPZFMatrix(&local_150);
  TPZFMatrix<double>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::ContributeKULocal(const TVar alpha, const TPZFMatrix<TVar> &u, TPZFMatrix<TVar> &z) const
{
	int i,j;
	int nglob = fNEquations;
	int ncols = u.Cols();
	int neqs = fNEquations-fNumInternalEquations;
	TPZFMatrix<TVar> uloc(nglob,ncols,0.), uborder(fNEquations-fNumInternalEquations,ncols,0.),resborder(fNEquations-fNumInternalEquations,ncols,0.);
	typedef std::pair<ENumbering,ENumbering> Numbering;
	Numbering relat(ExternalFirst,Submesh);
	Numbering relat2(InternalFirst,Submesh);
	typename std::map<std::pair<ENumbering, ENumbering> , TPZVec<int> >::const_iterator itrelat, itrelat2;
	itrelat = fPermutationsScatter.find(relat);
	itrelat2 = fPermutationsScatter.find(relat2);
	if(itrelat == fPermutationsScatter.end() || itrelat2 == fPermutationsScatter.end())
	{
		return;
	}
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Scatter from external do submesh" << itrelat->second << std::endl;
		sout << "Scatter from submesh to internal" << itrelat2->second << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	PermuteScatter(itrelat->second, u, uloc, 0, u.Rows());
	PermuteGather(itrelat2->second, uloc, uborder, fNumInternalEquations, fNEquations);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		u.Print("Input matrix ", sout);
		uloc.Print("Natural ordering matrix",sout);
		uborder.Print("Matrix passed to the matred object", sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	fMatRed->Multiply(uborder,resborder);
	
	TPZFMatrix<TVar> resglobal(nglob,ncols,0.),resloc(fNumExternalEquations,ncols,0.);
	PermuteScatter(itrelat2->second, resborder, resglobal, fNumInternalEquations, fNEquations);
	PermuteGather(itrelat->second, resglobal, resloc, 0, u.Rows());
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Value of the local multiply = ";
		resborder.Print("resborder " ,sout);
		resglobal.Print("resglobal ",sout);
		resloc.Print("resloc ",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
	int zcols = z.Cols();
	for (i=0;i<neqs;i++) {
		/* Sum row "i" of temp1 with row "fGlobalNodes[i]" of z */
		for (j=0;j<zcols;j++) {
			z(i,j) += alpha*resloc(i,j);
		}
	}
}